

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O1

int Io_MvParseLiteralMv(Io_MvMod_t *p,Abc_Obj_t *pNode,char *pToken,Vec_Str_t *vFunc,int iLit)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pObj;
  Io_MvMan_t *pIVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  uint *puVar7;
  int *piVar8;
  ulong uVar9;
  char cVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  char *pcVar14;
  size_t sVar15;
  size_t sVar16;
  char Buffer [10];
  char local_5a [10];
  char *local_50;
  Abc_Obj_t *local_48;
  Io_MvMod_t *local_40;
  uint *local_38;
  
  iVar4 = (pNode->vFanins).nSize;
  local_50 = pToken;
  if (*pToken == '=') {
    if (iVar4 < 1) {
      uVar12 = 0;
    }
    else {
      lVar13 = 0;
      do {
        pcVar5 = Abc_ObjName((Abc_Obj_t *)
                             pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar13]]);
        iVar4 = strcmp(pcVar5,pToken + 1);
        if (iVar4 == 0) break;
        lVar13 = lVar13 + 1;
      } while (lVar13 < (pNode->vFanins).nSize);
      uVar12 = (uint)lVar13;
    }
    if (uVar12 == (pNode->vFanins).nSize) {
      pVVar2 = p->pMan->vLines;
      uVar6 = (ulong)pVVar2->nSize;
      uVar9 = 0xffffffff;
      if (0 < (long)uVar6) {
        uVar11 = 0;
        do {
          if (local_50 < pVVar2->pArray[uVar11]) {
            uVar9 = uVar11 & 0xffffffff;
            break;
          }
          uVar11 = uVar11 + 1;
        } while (uVar6 != uVar11);
      }
      sprintf(p->pMan->sError,
              "Line %d: Node name in the table \"%s\" cannot be found on .names line.",uVar9,
              local_50 + 1);
      return 0;
    }
    uVar1 = vFunc->nCap;
    if (vFunc->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (vFunc->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(0x10);
        }
        else {
          pcVar5 = (char *)realloc(vFunc->pArray,0x10);
        }
        vFunc->pArray = pcVar5;
        sVar15 = 0x10;
      }
      else {
        sVar15 = (ulong)uVar1 * 2;
        if ((int)sVar15 <= (int)uVar1) goto LAB_00847486;
        if (vFunc->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(sVar15);
        }
        else {
          pcVar5 = (char *)realloc(vFunc->pArray,sVar15);
        }
        vFunc->pArray = pcVar5;
      }
      vFunc->nCap = (int)sVar15;
    }
LAB_00847486:
    iVar4 = vFunc->nSize;
    vFunc->nSize = iVar4 + 1;
    vFunc->pArray[iVar4] = '=';
    sprintf(local_5a,"%d",(ulong)uVar12);
    sVar15 = strlen(local_5a);
    if (0 < (int)(uint)sVar15) {
      uVar6 = 0;
      do {
        cVar10 = local_5a[uVar6];
        uVar12 = vFunc->nCap;
        if (vFunc->nSize == uVar12) {
          if ((int)uVar12 < 0x10) {
            if (vFunc->pArray == (char *)0x0) {
              pcVar5 = (char *)malloc(0x10);
            }
            else {
              pcVar5 = (char *)realloc(vFunc->pArray,0x10);
            }
            sVar16 = 0x10;
          }
          else {
            sVar16 = (ulong)uVar12 * 2;
            if ((int)sVar16 <= (int)uVar12) goto LAB_0084752d;
            if (vFunc->pArray == (char *)0x0) {
              pcVar5 = (char *)malloc(sVar16);
            }
            else {
              pcVar5 = (char *)realloc(vFunc->pArray,sVar16);
            }
          }
          vFunc->pArray = pcVar5;
          vFunc->nCap = (int)sVar16;
        }
LAB_0084752d:
        iVar4 = vFunc->nSize;
        vFunc->nSize = iVar4 + 1;
        vFunc->pArray[iVar4] = cVar10;
        uVar6 = uVar6 + 1;
      } while (((uint)sVar15 & 0x7fffffff) != uVar6);
    }
    cVar10 = ' ';
    if (iLit == -1) {
      cVar10 = '\n';
    }
    uVar12 = vFunc->nCap;
    if (vFunc->nSize != uVar12) goto LAB_008475c7;
    if ((int)uVar12 < 0x10) {
      if (vFunc->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vFunc->pArray,0x10);
      }
      sVar15 = 0x10;
    }
    else {
LAB_00847588:
      sVar15 = (ulong)uVar12 * 2;
      if ((int)sVar15 <= (int)uVar12) goto LAB_008475c7;
      if (vFunc->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar15);
      }
      else {
        pcVar5 = (char *)realloc(vFunc->pArray,sVar15);
      }
    }
    iVar4 = (int)sVar15;
    vFunc->pArray = pcVar5;
  }
  else {
    if (iVar4 <= iLit) {
      __assert_fail("iLit < Abc_ObjFaninNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioReadBlifMv.c"
                    ,0x694,
                    "int Io_MvParseLiteralMv(Io_MvMod_t *, Abc_Obj_t *, char *, Vec_Str_t *, int)");
    }
    if (iLit < 0) {
      piVar8 = (pNode->vFanouts).pArray;
    }
    else {
      piVar8 = (pNode->vFanins).pArray + (uint)iLit;
    }
    pObj = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*piVar8];
    local_40 = p;
    puVar7 = (uint *)Abc_ObjMvVar(pObj);
    if ((puVar7 == (uint *)0x0) || (*(long *)(puVar7 + 2) == 0)) {
      sVar15 = strlen(pToken);
      if (0 < (int)(uint)sVar15) {
        uVar6 = 0;
        do {
          cVar10 = pToken[uVar6];
          uVar12 = vFunc->nCap;
          if (vFunc->nSize == uVar12) {
            if ((int)uVar12 < 0x10) {
              if (vFunc->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(vFunc->pArray,0x10);
              }
              sVar16 = 0x10;
            }
            else {
              sVar16 = (ulong)uVar12 * 2;
              if ((int)sVar16 <= (int)uVar12) goto LAB_00847347;
              if (vFunc->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(sVar16);
              }
              else {
                pcVar5 = (char *)realloc(vFunc->pArray,sVar16);
              }
            }
            vFunc->pArray = pcVar5;
            vFunc->nCap = (int)sVar16;
          }
LAB_00847347:
          iVar4 = vFunc->nSize;
          vFunc->nSize = iVar4 + 1;
          vFunc->pArray[iVar4] = cVar10;
          uVar6 = uVar6 + 1;
        } while (((uint)sVar15 & 0x7fffffff) != uVar6);
      }
    }
    else {
      cVar10 = *pToken;
      local_48 = pObj;
      local_38 = puVar7;
      while (cVar10 != '\0') {
        iVar4 = Io_MvCharIsMvSymb(cVar10);
        if (iVar4 == 0) {
          sVar15 = 1;
          pcVar5 = pToken;
          do {
            pcVar14 = pcVar5;
            sVar16 = sVar15;
            if (pcVar14[1] == '\0') break;
            iVar4 = Io_MvCharIsMvSymb(pcVar14[1]);
            sVar15 = sVar16 + 1;
            pcVar5 = pcVar14 + 1;
          } while (iVar4 == 0);
          uVar12 = *local_38;
          if ((int)uVar12 < 1) {
            uVar6 = 0;
          }
          else {
            lVar13 = *(long *)(local_38 + 2);
            uVar6 = 0;
            do {
              iVar4 = strncmp(*(char **)(lVar13 + uVar6 * 8),pToken,sVar16);
              if (iVar4 == 0) goto LAB_008471b8;
              uVar6 = uVar6 + 1;
            } while (uVar12 != uVar6);
            uVar6 = (ulong)uVar12;
          }
LAB_008471b8:
          if ((uint)uVar6 == uVar12) {
            pcVar14[1] = '\0';
            pIVar3 = local_40->pMan;
            pVVar2 = pIVar3->vLines;
            uVar6 = (ulong)pVVar2->nSize;
            uVar9 = 0xffffffff;
            if ((long)uVar6 < 1) goto LAB_008475f3;
            uVar11 = 0;
            goto LAB_00847440;
          }
          sprintf(local_5a,"%d",uVar6 & 0xffffffff);
          sVar15 = strlen(local_5a);
          if (0 < (int)(uint)sVar15) {
            uVar6 = 0;
            do {
              cVar10 = local_5a[uVar6];
              uVar12 = vFunc->nCap;
              if (vFunc->nSize == uVar12) {
                if ((int)uVar12 < 0x10) {
                  if (vFunc->pArray == (char *)0x0) {
                    pcVar5 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar5 = (char *)realloc(vFunc->pArray,0x10);
                  }
                  sVar16 = 0x10;
                }
                else {
                  sVar16 = (ulong)uVar12 * 2;
                  if ((int)sVar16 <= (int)uVar12) goto LAB_00847254;
                  if (vFunc->pArray == (char *)0x0) {
                    pcVar5 = (char *)malloc(sVar16);
                  }
                  else {
                    pcVar5 = (char *)realloc(vFunc->pArray,sVar16);
                  }
                }
                vFunc->pArray = pcVar5;
                vFunc->nCap = (int)sVar16;
              }
LAB_00847254:
              iVar4 = vFunc->nSize;
              vFunc->nSize = iVar4 + 1;
              vFunc->pArray[iVar4] = cVar10;
              uVar6 = uVar6 + 1;
            } while (((uint)sVar15 & 0x7fffffff) != uVar6);
          }
        }
        else {
          uVar12 = vFunc->nCap;
          if (vFunc->nSize == uVar12) {
            if ((int)uVar12 < 0x10) {
              if (vFunc->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(vFunc->pArray,0x10);
              }
              vFunc->pArray = pcVar5;
              sVar15 = 0x10;
            }
            else {
              sVar15 = (ulong)uVar12 * 2;
              if ((int)sVar15 <= (int)uVar12) goto LAB_008472a4;
              if (vFunc->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(sVar15);
              }
              else {
                pcVar5 = (char *)realloc(vFunc->pArray,sVar15);
              }
              vFunc->pArray = pcVar5;
            }
            vFunc->nCap = (int)sVar15;
          }
LAB_008472a4:
          iVar4 = vFunc->nSize;
          vFunc->nSize = iVar4 + 1;
          vFunc->pArray[iVar4] = cVar10;
          pcVar14 = pToken;
        }
        pToken = pcVar14 + 1;
        cVar10 = pcVar14[1];
      }
    }
    cVar10 = ' ';
    if (iLit == -1) {
      cVar10 = '\n';
    }
    uVar12 = vFunc->nCap;
    if (vFunc->nSize != uVar12) goto LAB_008475c7;
    if (0xf < (int)uVar12) goto LAB_00847588;
    if (vFunc->pArray == (char *)0x0) {
      pcVar5 = (char *)malloc(0x10);
    }
    else {
      pcVar5 = (char *)realloc(vFunc->pArray,0x10);
    }
    vFunc->pArray = pcVar5;
    iVar4 = 0x10;
  }
  vFunc->nCap = iVar4;
LAB_008475c7:
  iVar4 = vFunc->nSize;
  vFunc->nSize = iVar4 + 1;
  vFunc->pArray[iVar4] = cVar10;
  return 1;
  while (uVar11 = uVar11 + 1, uVar6 != uVar11) {
LAB_00847440:
    if (local_50 < pVVar2->pArray[uVar11]) {
      uVar9 = uVar11 & 0xffffffff;
      break;
    }
  }
LAB_008475f3:
  pcVar5 = Abc_ObjName(local_48);
  sprintf(pIVar3->sError,
          "Line %d: Cannot find value name \"%s\" among the value names of variable \"%s\".",uVar9,
          pToken,pcVar5);
  return 0;
}

Assistant:

static int Io_MvParseLiteralMv( Io_MvMod_t * p, Abc_Obj_t * pNode, char * pToken, Vec_Str_t * vFunc, int iLit )
{
    char Buffer[10];
    Io_MvVar_t * pVar;
    Abc_Obj_t * pFanin, * pNet;
    char * pCur, * pNext;
    int i;
    // consider the equality literal
    if ( pToken[0] == '=' )
    {
        // find the fanins
        Abc_ObjForEachFanin( pNode, pFanin, i )
            if ( !strcmp( Abc_ObjName(pFanin), pToken + 1 ) )
                break;
        if ( i == Abc_ObjFaninNum(pNode) )
        {
            sprintf( p->pMan->sError, "Line %d: Node name in the table \"%s\" cannot be found on .names line.", 
                Io_MvGetLine(p->pMan, pToken), pToken + 1 );
            return 0;
        }
        Vec_StrPush( vFunc, '=' );
        sprintf( Buffer, "%d", i );
        Vec_StrPrintStr( vFunc, Buffer );
        Vec_StrPush( vFunc, (char)((iLit == -1)? '\n' : ' ') );
        return 1;
    }
    // consider regular literal
    assert( iLit < Abc_ObjFaninNum(pNode) );
    pNet = iLit >= 0 ? Abc_ObjFanin(pNode, iLit) : Abc_ObjFanout0(pNode);
    pVar = (Io_MvVar_t *)Abc_ObjMvVar( pNet );
    // if the var is absent or has no symbolic values quit
    if ( pVar == NULL || pVar->pNames == NULL )
    {
        Vec_StrPrintStr( vFunc, pToken );
        Vec_StrPush( vFunc, (char)((iLit == -1)? '\n' : ' ') );
        return 1;
    }
    // parse the literal using symbolic values
    for ( pCur = pToken; *pCur; pCur++ )
    {
        if ( Io_MvCharIsMvSymb(*pCur) )
        {
            Vec_StrPush( vFunc, *pCur );
            continue;
        }
        // find the next MvSymb char
        for ( pNext = pCur+1; *pNext; pNext++ )
            if ( Io_MvCharIsMvSymb(*pNext) )
                break;
        // look for the value name
        for ( i = 0; i < pVar->nValues; i++ )
            if ( !strncmp( pVar->pNames[i], pCur, pNext-pCur ) )
                break;
        if ( i == pVar->nValues )
        {
            *pNext = 0;
            sprintf( p->pMan->sError, "Line %d: Cannot find value name \"%s\" among the value names of variable \"%s\".", 
                Io_MvGetLine(p->pMan, pToken), pCur, Abc_ObjName(pNet) );
            return 0;
        }
        // value name is found
        sprintf( Buffer, "%d", i );
        Vec_StrPrintStr( vFunc, Buffer );
        // update the pointer
        pCur = pNext - 1;
    }
    Vec_StrPush( vFunc, (char)((iLit == -1)? '\n' : ' ') );
    return 1;
}